

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O3

void __thiscall chrono::ChLinkMateCoaxial::ArchiveIN(ChLinkMateCoaxial *this,ChArchiveIn *marchive)

{
  ChArchiveIn::VersionRead<chrono::ChLinkMateCoaxial>(marchive);
  ChLinkMateGeneric::ArchiveIN(&this->super_ChLinkMateGeneric,marchive);
  (**(code **)(*(long *)marchive + 0x10))(marchive);
  return;
}

Assistant:

void ChLinkMateCoaxial::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMateCoaxial>();

    // deserialize parent class
    ChLinkMateGeneric::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(flipped);
}